

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

SegmentReader * __thiscall capnp::_::BuilderArena::tryGetSegment(BuilderArena *this,SegmentId id)

{
  bool bVar1;
  BuilderArena *pBVar2;
  ulong uVar3;
  MultiSegmentState *pMVar4;
  size_t sVar5;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *this_00;
  SegmentReader *pSVar6;
  SegmentBuilder *local_40;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *local_38;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *segmentState;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *_segmentState340;
  BuilderArena *local_20;
  BuilderArena *this_local;
  SegmentReader *pSStack_10;
  SegmentId id_local;
  
  local_20 = this;
  this_local._4_4_ = id.value;
  kj::Id<unsigned_int,_capnp::_::Segment>::Id
            ((Id<unsigned_int,_capnp::_::Segment> *)((long)&_segmentState340 + 4),0);
  bVar1 = kj::Id<unsigned_int,_capnp::_::Segment>::operator==
                    ((Id<unsigned_int,_capnp::_::Segment> *)((long)&this_local + 4),
                     (Id<unsigned_int,_capnp::_::Segment> *)((long)&_segmentState340 + 4));
  if (bVar1) {
    pBVar2 = SegmentBuilder::getArena(&this->segment0);
    if (pBVar2 == (BuilderArena *)0x0) {
      pSStack_10 = (SegmentReader *)0x0;
    }
    else {
      pSStack_10 = &(this->segment0).super_SegmentReader;
    }
  }
  else {
    local_38 = kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState,decltype(nullptr)>
                         (&this->moreSegments);
    if (local_38 != (Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)0x0) {
      uVar3 = (ulong)this_local._4_4_;
      segmentState = local_38;
      pMVar4 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get(local_38);
      sVar5 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size
                        (&pMVar4->builders);
      if (uVar3 <= sVar5) {
        pMVar4 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get(local_38);
        this_00 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::operator[]
                            (&pMVar4->builders,(ulong)(this_local._4_4_ - 1));
        local_40 = kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::get(this_00);
        pSVar6 = kj::implicitCast<capnp::_::SegmentReader_const*,capnp::_::SegmentBuilder*>
                           (&local_40);
        return pSVar6;
      }
    }
    pSStack_10 = (SegmentReader *)0x0;
  }
  return pSStack_10;
}

Assistant:

SegmentReader* BuilderArena::tryGetSegment(SegmentId id) {
  if (id == SegmentId(0)) {
    if (segment0.getArena() == nullptr) {
      // We haven't allocated any segments yet.
      return nullptr;
    } else {
      return &segment0;
    }
  } else {
    KJ_IF_SOME(segmentState, moreSegments) {
      if (id.value <= segmentState.get()->builders.size()) {
        // TODO(cleanup):  Return a const SegmentReader and tediously constify all SegmentBuilder
        //   pointers throughout the codebase.
        return const_cast<SegmentReader*>(kj::implicitCast<const SegmentReader*>(
            segmentState.get()->builders[id.value - 1].get()));
      }
    }
    return nullptr;
  }
}